

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

Instr * __thiscall
Inline::InlineCallApplyTarget_Shared
          (Inline *this,Instr *callInstr,bool originalCallTargetOpndIsJITOpt,
          StackSym *originalCallTargetStackSym,FunctionJITTimeInfo *inlineeData,
          uint inlineCacheIndex,bool safeThis,bool isApplyTarget,
          CallApplyTargetSourceType targetType,Instr *inlineeDefInstr,uint recursiveInlineDepth,
          Instr *funcObjCheckInsertInstr)

{
  ProfileId callSiteId;
  JITTimeWorkItem *this_00;
  Func *pFVar1;
  JitArenaAllocator *alloc;
  ThreadContextInfo *threadContextInfo;
  ScriptContextInfo *scriptContextInfo;
  ScriptContextProfiler *codeGenProfiler;
  void *codeGenAllocators;
  Instr *instrNext;
  code *pcVar2;
  bool bVar3;
  ExecutionMode EVar4;
  ProfileId PVar5;
  uint uVar6;
  uint uVar7;
  RegSlot returnValueRegSlot;
  uint32 postCallByteCodeOffset;
  JITTimeFunctionBody *pJVar8;
  char16 *pcVar9;
  char16 *pcVar10;
  Opnd *this_01;
  RegOpnd *returnValueOpnd;
  undefined4 *puVar11;
  ProfiledInstr *pPVar12;
  CodeGenWorkItemIDL *workItemData;
  CodeGenWorkItemIDL *pCVar13;
  JITTimeWorkItem *this_02;
  FunctionJITTimeInfo *pFVar14;
  intptr_t iVar15;
  Func *this_03;
  JITOutputIDL *outputData;
  wchar local_108 [4];
  char16 debugStringBuffer [42];
  FunctionJITRuntimeInfo *local_48;
  JITTimePolymorphicInlineCacheInfo *local_38;
  
  unique0x1000075e = originalCallTargetStackSym;
  if (inlineeDefInstr != (Instr *)0x0) {
    uVar6 = Func::GetSourceContextId(this->topFunc);
    uVar7 = Func::GetLocalFunctionId(this->topFunc);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlineCallbacksPhase,uVar6,uVar7);
    if (!bVar3) {
      uVar6 = Func::GetSourceContextId(this->topFunc);
      uVar7 = Func::GetLocalFunctionId(this->topFunc);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,InlineCallbacksPhase,uVar6,uVar7);
      if (!bVar3) goto LAB_0050aa12;
    }
    pJVar8 = FunctionJITTimeInfo::GetBody(inlineeData);
    pcVar9 = JITTimeFunctionBody::GetDisplayName(pJVar8);
    pcVar10 = FunctionJITTimeInfo::GetDebugNumberSet(inlineeData,(wchar (*) [42])local_108);
    Output::Print(L"INLINING CALLBACK : Inlining callback for call/apply target : \t%s (%s)\n",
                  pcVar9,pcVar10);
    Output::Flush();
  }
LAB_0050aa12:
  if (callInstr->m_dst == (Opnd *)0x0) {
    returnValueRegSlot = 0xffffffff;
    returnValueOpnd = (RegOpnd *)0x0;
  }
  else {
    this_01 = IR::Instr::UnlinkDst(callInstr);
    returnValueOpnd = IR::Opnd::AsRegOpnd(this_01);
    returnValueRegSlot = StackSym::GetByteCodeRegSlot(returnValueOpnd->m_sym);
  }
  if (callInstr->m_kind != InstrKindProfiled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xc50,"(callInstr->IsProfiledInstr())","callInstr->IsProfiledInstr()");
    if (!bVar3) goto LAB_0050adda;
    *puVar11 = 0;
  }
  pPVar12 = IR::Instr::AsProfiledInstr(callInstr);
  callSiteId = (pPVar12->u).field_3.fldInfoData.f1;
  workItemData = (CodeGenWorkItemIDL *)
                 new<Memory::JitArenaAllocator>(0x60,this->topFunc->m_alloc,0x3d6ef4);
  bVar3 = Func::IsJitInDebugMode(this->topFunc);
  workItemData->isJitInDebugMode = bVar3;
  workItemData->type = '\0';
  EVar4 = JITTimeWorkItem::GetJitMode(this->topFunc->m_workItem);
  workItemData->jitMode = EVar4;
  pCVar13 = JITTimeWorkItem::GetWorkItemData(this->topFunc->m_workItem);
  workItemData->nativeDataAddr = pCVar13->nativeDataAddr;
  workItemData->loopNumber = 0xffffffff;
  workItemData->jitData = &inlineeData->m_data;
  this_02 = (JITTimeWorkItem *)new<Memory::JitArenaAllocator>(0x1e0,this->topFunc->m_alloc,0x3d6ef4)
  ;
  JITTimeWorkItem::JITTimeWorkItem(this_02,workItemData);
  if (targetType == Other) {
    pJVar8 = Func::GetJITFunctionBody(callInstr->m_func);
    PVar5 = JITTimeFunctionBody::GetCallApplyCallSiteIdForCallSiteId(pJVar8,callSiteId);
    pFVar14 = JITTimeWorkItem::GetJITTimeInfo(callInstr->m_func->m_workItem);
    local_48 = FunctionJITTimeInfo::GetCallApplyTargetInlineeRuntimeData(pFVar14,PVar5);
  }
  else if (targetType == Callback) {
    pFVar14 = JITTimeWorkItem::GetJITTimeInfo(inlineeDefInstr->m_func->m_workItem);
    pPVar12 = IR::Instr::AsProfiledInstr(inlineeDefInstr);
    PVar5 = (pPVar12->u).field_3.fldInfoData.f1;
    pJVar8 = FunctionJITTimeInfo::GetBody(inlineeData);
    iVar15 = JITTimeFunctionBody::GetAddr(pJVar8);
    local_48 = FunctionJITTimeInfo::GetInlineeForCallbackInlineeRuntimeData(pFVar14,PVar5,iVar15);
  }
  else if (targetType == LdFld) {
    pFVar14 = JITTimeWorkItem::GetJITTimeInfo(callInstr->m_func->m_workItem);
    local_48 = FunctionJITTimeInfo::GetLdFldInlineeRuntimeData(pFVar14,inlineCacheIndex);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xc72,"((0))","UNREACHED");
    if (!bVar3) {
LAB_0050adda:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar11 = 0;
  }
  bVar3 = FunctionJITTimeInfo::HasBody(inlineeData);
  if (bVar3) {
    this_00 = this->topFunc->m_workItem;
    pJVar8 = FunctionJITTimeInfo::GetBody(inlineeData);
    iVar15 = JITTimeFunctionBody::GetAddr(pJVar8);
    local_38 = JITTimeWorkItem::GetInlineePolymorphicInlineCacheInfo(this_00,iVar15);
  }
  else {
    local_38 = (JITTimePolymorphicInlineCacheInfo *)0x0;
  }
  this_03 = (Func *)new<Memory::JitArenaAllocator>(0x420,this->topFunc->m_alloc,0x3d6ef4);
  pFVar1 = this->topFunc;
  alloc = pFVar1->m_alloc;
  threadContextInfo = pFVar1->m_threadContextInfo;
  scriptContextInfo = pFVar1->m_scriptContextInfo;
  outputData = JITOutput::GetOutputData(&pFVar1->m_output);
  pFVar1 = this->topFunc;
  codeGenProfiler = pFVar1->m_codeGenProfiler;
  codeGenAllocators = pFVar1->topFunc->m_codeGenAllocators;
  bVar3 = pFVar1->m_isBackgroundJIT;
  pFVar1 = callInstr->m_func;
  postCallByteCodeOffset = IR::Instr::GetByteCodeOffset(callInstr->m_next);
  Func::Func(this_03,alloc,this_02,threadContextInfo,scriptContextInfo,outputData,
             (EntryPointInfo *)0x0,local_48,local_38,codeGenAllocators,codeGenProfiler,bVar3,pFVar1,
             postCallByteCodeOffset,returnValueRegSlot,false,callSiteId,false);
  instrNext = callInstr->m_next;
  InlineFunctionCommon
            (this,callInstr,originalCallTargetOpndIsJITOpt,stack0xffffffffffffff50,inlineeData,
             this_03,instrNext,returnValueOpnd,funcObjCheckInsertInstr,(StackSym *)0x0,
             recursiveInlineDepth,safeThis,isApplyTarget);
  return instrNext;
}

Assistant:

IR::Instr *
Inline::InlineCallApplyTarget_Shared(
    IR::Instr *callInstr, 
    bool originalCallTargetOpndIsJITOpt, 
    StackSym* originalCallTargetStackSym, 
    const FunctionJITTimeInfo *const inlineeData,
    uint inlineCacheIndex, 
    bool safeThis,
    bool isApplyTarget, 
    CallApplyTargetSourceType targetType, 
    IR::Instr * inlineeDefInstr, 
    uint recursiveInlineDepth,
    IR::Instr * funcObjCheckInsertInstr)
{
    const bool isCallback = inlineeDefInstr != nullptr;

#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (isCallback)
    {
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        INLINE_CALLBACKS_TRACE(_u("INLINING CALLBACK : Inlining callback for call/apply target : \t%s (%s)\n"), inlineeData->GetBody()->GetDisplayName(),
            inlineeData->GetDebugNumberSet(debugStringBuffer));
    }
#endif

    // returnValueOpnd
    IR::RegOpnd * returnValueOpnd;
    Js::RegSlot returnRegSlot;
    if (callInstr->GetDst())
    {
        returnValueOpnd = callInstr->UnlinkDst()->AsRegOpnd();
        returnRegSlot = returnValueOpnd->m_sym->GetByteCodeRegSlot();
    }
    else
    {
        returnValueOpnd = nullptr;
        returnRegSlot = Js::Constants::NoRegister;
    }

    Assert(callInstr->IsProfiledInstr());
    Js::ProfileId callSiteId = static_cast<Js::ProfileId>(callInstr->AsProfiledInstr()->u.profileId);

    // inlinee
    CodeGenWorkItemIDL * workItemData = JitAnewStruct(this->topFunc->m_alloc, CodeGenWorkItemIDL);

    workItemData->isJitInDebugMode = this->topFunc->IsJitInDebugMode();
    workItemData->type = JsFunctionType;
    workItemData->jitMode = static_cast<char>(this->topFunc->GetWorkItem()->GetJitMode());
    workItemData->nativeDataAddr = this->topFunc->GetWorkItem()->GetWorkItemData()->nativeDataAddr;
    workItemData->loopNumber = Js::LoopHeader::NoLoop;

    workItemData->jitData = (FunctionJITTimeDataIDL*)(inlineeData);
    JITTimeWorkItem * jitWorkItem = JitAnew(this->topFunc->m_alloc, JITTimeWorkItem, workItemData);

    const FunctionJITRuntimeInfo * runtimeInfo;
    switch (targetType)
    {
    case CallApplyTargetSourceType::LdFld:
        runtimeInfo = callInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetLdFldInlineeRuntimeData(inlineCacheIndex);
        break;

    case CallApplyTargetSourceType::Callback:
        runtimeInfo = inlineeDefInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetInlineeForCallbackInlineeRuntimeData(static_cast<Js::ProfileId>(inlineeDefInstr->AsProfiledInstr()->u.profileId), inlineeData->GetBody()->GetAddr());
        break;

    case CallApplyTargetSourceType::Other:
    {
        Js::ProfileId callApplyCallSiteId = callInstr->m_func->GetJITFunctionBody()->GetCallApplyCallSiteIdForCallSiteId(callSiteId);
        runtimeInfo = callInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetCallApplyTargetInlineeRuntimeData(callApplyCallSiteId);
        break;
    }

    default:
        Assert(UNREACHED);
        __assume(UNREACHED);
        break;
    }

    JITTimePolymorphicInlineCacheInfo * entryPointPolymorphicInlineCacheInfo = inlineeData->HasBody() ? this->topFunc->GetWorkItem()->GetInlineePolymorphicInlineCacheInfo(inlineeData->GetBody()->GetAddr()) : nullptr;
#if !FLOATVAR
    Func * inlinee = JitAnew(this->topFunc->m_alloc,
        Func,
        this->topFunc->m_alloc,
        jitWorkItem,
        this->topFunc->GetThreadContextInfo(),
        this->topFunc->GetScriptContextInfo(),
        this->topFunc->GetJITOutput()->GetOutputData(),
        nullptr,
        runtimeInfo,
        entryPointPolymorphicInlineCacheInfo,
        this->topFunc->GetCodeGenAllocators(),
        this->topFunc->GetNumberAllocator(),
        this->topFunc->GetCodeGenProfiler(),
        this->topFunc->IsBackgroundJIT(),
        callInstr->m_func,
        callInstr->m_next->GetByteCodeOffset(),
        returnRegSlot,
        false,
        callSiteId,
        false);
#else
    Func * inlinee = JitAnew(this->topFunc->m_alloc,
        Func,
        this->topFunc->m_alloc,
        jitWorkItem,
        this->topFunc->GetThreadContextInfo(),
        this->topFunc->GetScriptContextInfo(),
        this->topFunc->GetJITOutput()->GetOutputData(),
        nullptr,
        runtimeInfo,
        entryPointPolymorphicInlineCacheInfo,
        this->topFunc->GetCodeGenAllocators(),
        this->topFunc->GetCodeGenProfiler(),
        this->topFunc->IsBackgroundJIT(),
        callInstr->m_func,
        callInstr->m_next->GetByteCodeOffset(),
        returnRegSlot,
        false,
        callSiteId,
        false);
#endif

    // instrNext
    IR::Instr* instrNext = callInstr->m_next;

    return InlineFunctionCommon(callInstr, originalCallTargetOpndIsJITOpt, originalCallTargetStackSym, inlineeData, inlinee, instrNext, returnValueOpnd, funcObjCheckInsertInstr, nullptr, recursiveInlineDepth, safeThis, isApplyTarget);
}